

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

int insertNewKeyValue(MAP_HANDLE_DATA *handleData,char *key,char *value)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  char **ppcVar5;
  LOGGER_LOG p_Var6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  
  uVar4 = handleData->count + 1;
  uVar8 = 0xffffffffffffffff;
  if (uVar4 != 0) {
    uVar8 = uVar4;
  }
  if ((uVar8 >> 0x3d == 0) &&
     (ppcVar5 = (char **)realloc(handleData->keys,uVar8 << 3), ppcVar5 != (char **)0x0)) {
    handleData->keys = ppcVar5;
    sVar1 = handleData->count;
    ppcVar5[sVar1] = (char *)0x0;
    uVar8 = sVar1 + 1;
    if (uVar8 == 0) {
      uVar8 = 0xffffffffffffffff;
    }
    sVar2 = 0xffffffffffffffff;
    if ((0x1fffffffffffffff < uVar8) ||
       (ppcVar5 = (char **)realloc(handleData->values,uVar8 * 8), sVar2 = uVar8 * 8,
       ppcVar5 == (char **)0x0)) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
                  ,"Map_IncreaseStorageKeysValues",0xb9,1,"realloc error, size:%zu",sVar2);
      }
      uVar8 = handleData->count;
      if (uVar8 == 0) {
        free(handleData->keys);
        handleData->keys = (char **)0x0;
      }
      else {
        if ((0x1fffffffffffffff < uVar8) ||
           (ppcVar5 = (char **)realloc(handleData->keys,uVar8 * 8), ppcVar5 == (char **)0x0)) {
          p_Var6 = xlogging_get_log_function();
          iVar3 = 0x138;
          if (p_Var6 == (LOGGER_LOG)0x0) {
            return 0x138;
          }
          pcVar9 = "Map_IncreaseStorageKeysValues";
          pcVar10 = "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu"
          ;
          iVar7 = 0xc6;
          goto LAB_0011779b;
        }
        handleData->keys = ppcVar5;
      }
      return 0x138;
    }
    handleData->values = ppcVar5;
    sVar1 = handleData->count;
    ppcVar5[sVar1] = (char *)0x0;
    handleData->count = sVar1 + 1;
    iVar3 = mallocAndStrcpy_s(handleData->keys + sVar1,key);
    if (iVar3 == 0) {
      iVar3 = mallocAndStrcpy_s(handleData->values + (handleData->count - 1),value);
      if (iVar3 == 0) {
        return 0;
      }
      free(handleData->keys[handleData->count - 1]);
      Map_DecreaseStorageKeysValues(handleData);
      p_Var6 = xlogging_get_log_function();
      iVar3 = 0x149;
      if (p_Var6 == (LOGGER_LOG)0x0) {
        return 0x149;
      }
      pcVar9 = "insertNewKeyValue";
      pcVar10 = "unable to mallocAndStrcpy_s";
      iVar7 = 0x148;
    }
    else {
      Map_DecreaseStorageKeysValues(handleData);
      p_Var6 = xlogging_get_log_function();
      iVar3 = 0x140;
      if (p_Var6 == (LOGGER_LOG)0x0) {
        return 0x140;
      }
      pcVar9 = "insertNewKeyValue";
      pcVar10 = "unable to mallocAndStrcpy_s";
      iVar7 = 0x13f;
    }
  }
  else {
    p_Var6 = xlogging_get_log_function();
    iVar3 = 0x138;
    if (p_Var6 == (LOGGER_LOG)0x0) {
      return 0x138;
    }
    pcVar9 = "Map_IncreaseStorageKeysValues";
    pcVar10 = "realloc error, size:%zu";
    iVar7 = 0xac;
  }
LAB_0011779b:
  (*p_Var6)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/map.c"
            ,pcVar9,iVar7,1,pcVar10);
  return iVar3;
}

Assistant:

static int Map_IncreaseStorageKeysValues(MAP_HANDLE_DATA* handleData)
{
    int result;
    char** newKeys;
    size_t realloc_size = safe_add_size_t(handleData->count, 1);
    realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));
    if (realloc_size == SIZE_MAX ||
        (newKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
    {
        LogError("realloc error, size:%zu", realloc_size);
        result = MU_FAILURE;
    }
    else
    {
        char** newValues;
        handleData->keys = newKeys;
        handleData->keys[handleData->count] = NULL;
        realloc_size = safe_add_size_t(handleData->count, 1);
        realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));
        if (realloc_size == SIZE_MAX ||
            (newValues = (char**)realloc(handleData->values, realloc_size)) == NULL)
        {
            LogError("realloc error, size:%zu", realloc_size);
            if (handleData->count == 0) /*avoiding an implementation defined behavior */
            {
                free(handleData->keys);
                handleData->keys = NULL;
            }
            else
            {
                char** undoneKeys;
                realloc_size = safe_multiply_size_t((handleData->count), sizeof(char*));
                if (realloc_size == SIZE_MAX ||
                    (undoneKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
                {
                    LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
                }
                else
                {
                    handleData->keys = undoneKeys;
                }
            }
            result = MU_FAILURE;
        }
        else
        {
            handleData->values = newValues;
            handleData->values[handleData->count] = NULL;
            handleData->count++;
            result = 0;
        }
    }
    return result;
}